

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *
llvm::cl::getRegisteredOptions(SubCommand *Sub)

{
  bool bVar1;
  SubCommand *local_10;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  local_10 = Sub;
  bVar1 = is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
                    ((SmallPtrSet<llvm::cl::SubCommand_*,_4U> *)
                     ((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xe8),&local_10);
  if (bVar1) {
    return &Sub->OptionsMap;
  }
  __assert_fail("is_contained(Subs, &Sub)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x89a,"StringMap<Option *> &llvm::cl::getRegisteredOptions(SubCommand &)");
}

Assistant:

StringMap<Option *> &cl::getRegisteredOptions(SubCommand &Sub) {
  auto &Subs = GlobalParser->RegisteredSubCommands;
  (void)Subs;
  assert(is_contained(Subs, &Sub));
  return Sub.OptionsMap;
}